

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store_register.c
# Opt level: O0

OSSL_STORE_LOADER * OSSL_STORE_LOADER_new(ENGINE *e,char *scheme)

{
  char *in_RSI;
  ENGINE *in_RDI;
  OSSL_STORE_LOADER *res;
  char *func;
  OSSL_STORE_LOADER *local_8;
  
  func = (char *)0x0;
  if (in_RSI == (char *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_RDI,(int)((ulong)in_RSI >> 0x20),func);
    ERR_set_error(0x2c,0x6a,(char *)0x0);
    local_8 = (OSSL_STORE_LOADER *)0x0;
  }
  else {
    local_8 = (OSSL_STORE_LOADER *)CRYPTO_zalloc((size_t)in_RDI,in_RSI,0);
    if (local_8 == (OSSL_STORE_LOADER *)0x0) {
      ERR_new();
      ERR_set_debug((char *)in_RDI,(int)((ulong)in_RSI >> 0x20),(char *)local_8);
      ERR_set_error(0x2c,0xc0100,(char *)0x0);
      local_8 = (OSSL_STORE_LOADER *)0x0;
    }
    else {
      local_8->engine = in_RDI;
      local_8->scheme = in_RSI;
    }
  }
  return local_8;
}

Assistant:

OSSL_STORE_LOADER *OSSL_STORE_LOADER_new(ENGINE *e, const char *scheme)
{
    OSSL_STORE_LOADER *res = NULL;

    /*
     * We usually don't check NULL arguments.  For loaders, though, the
     * scheme is crucial and must never be NULL, or the user will get
     * mysterious errors when trying to register the created loader
     * later on.
     */
    if (scheme == NULL) {
        ERR_raise(ERR_LIB_OSSL_STORE, OSSL_STORE_R_INVALID_SCHEME);
        return NULL;
    }

    if ((res = OPENSSL_zalloc(sizeof(*res))) == NULL) {
        ERR_raise(ERR_LIB_OSSL_STORE, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    res->engine = e;
    res->scheme = scheme;
    return res;
}